

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O0

void __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::replaceUnsigned<double,unsigned_int>
          (LLVMNonTrappingFPToIntLoweringImpl *this,Unary *curr)

{
  BinaryOp BVar1;
  uint uVar2;
  UnaryOp op;
  Module *wasm;
  Function *func;
  LocalSet *left;
  Const *pCVar3;
  Binary *pBVar4;
  LocalGet *pLVar5;
  Binary *right;
  Unary *ifTrue;
  If *expression;
  PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
  *this_00;
  optional<wasm::Type> type;
  optional<wasm::Type> local_60;
  uintptr_t local_50;
  uintptr_t local_48;
  uintptr_t local_40;
  uintptr_t local_38;
  Index local_2c;
  Index v;
  Builder builder;
  BinaryOp geOp;
  BinaryOp ltOp;
  Unary *curr_local;
  LLVMNonTrappingFPToIntLoweringImpl *this_local;
  
  switch(curr->op) {
  case TruncSatUFloat32ToInt32:
  case TruncSatUFloat32ToInt64:
    builder.wasm._4_4_ = LtFloat32;
    builder.wasm._0_4_ = GeFloat32;
    break;
  default:
    handle_unreachable("Unexpected opcode",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                       ,0x69);
  case TruncSatUFloat64ToInt32:
  case TruncSatUFloat64ToInt64:
    builder.wasm._4_4_ = LtFloat64;
    builder.wasm._0_4_ = GeFloat64;
  }
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
             ).
             super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
  ;
  wasm = Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         ::getModule(&this_00->
                      super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                    );
  Builder::Builder((Builder *)&stack0xffffffffffffffd8,wasm);
  func = Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         ::getFunction(&this_00->
                        super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      );
  local_38 = (curr->value->type).id;
  local_2c = Builder::addVar(func,(Type)local_38);
  BVar1 = builder.wasm._4_4_;
  local_40 = (curr->value->type).id;
  left = Builder::makeLocalTee
                   ((Builder *)&stack0xffffffffffffffd8,local_2c,curr->value,(Type)local_40);
  uVar2 = std::numeric_limits<unsigned_int>::max();
  pCVar3 = Builder::makeConst<double>((Builder *)&stack0xffffffffffffffd8,(double)uVar2);
  pBVar4 = Builder::makeBinary((Builder *)&stack0xffffffffffffffd8,BVar1,(Expression *)left,
                               (Expression *)pCVar3);
  BVar1 = (BinaryOp)builder.wasm;
  local_48 = (curr->value->type).id;
  pLVar5 = Builder::makeLocalGet((Builder *)&stack0xffffffffffffffd8,local_2c,(Type)local_48);
  pCVar3 = Builder::makeConst<double>((Builder *)&stack0xffffffffffffffd8,0.0);
  right = Builder::makeBinary((Builder *)&stack0xffffffffffffffd8,BVar1,(Expression *)pLVar5,
                              (Expression *)pCVar3);
  pBVar4 = Builder::makeBinary((Builder *)&stack0xffffffffffffffd8,AndInt32,(Expression *)pBVar4,
                               (Expression *)right);
  op = getReplacementOp(this,curr->op);
  local_50 = (curr->value->type).id;
  pLVar5 = Builder::makeLocalGet((Builder *)&stack0xffffffffffffffd8,local_2c,(Type)local_50);
  ifTrue = Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,op,(Expression *)pLVar5);
  pCVar3 = Builder::makeConst<unsigned_int>((Builder *)&stack0xffffffffffffffd8,0);
  std::optional<wasm::Type>::optional(&local_60);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_60.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_60.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  expression = Builder::makeIf((Builder *)&stack0xffffffffffffffd8,(Expression *)pBVar4,
                               (Expression *)ifTrue,(Expression *)pCVar3,type);
  Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
  ::replaceCurrent(&this_00->
                    super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                   ,(Expression *)expression);
  return;
}

Assistant:

void replaceUnsigned(Unary* curr) {
    BinaryOp ltOp, geOp;

    switch (curr->op) {
      case TruncSatUFloat32ToInt32:
      case TruncSatUFloat32ToInt64:
        ltOp = LtFloat32;
        geOp = GeFloat32;
        break;
      case TruncSatUFloat64ToInt32:
      case TruncSatUFloat64ToInt64:
        ltOp = LtFloat64;
        geOp = GeFloat64;
        break;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }

    Builder builder(*getModule());
    Index v = Builder::addVar(getFunction(), curr->value->type);
    // if op < INT_MAX and op >= 0 then use the trapping operation, else return
    // 0
    replaceCurrent(builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          ltOp,
          builder.makeLocalTee(v, curr->value, curr->value->type),
          builder.makeConst(static_cast<From>(std::numeric_limits<To>::max()))),
        builder.makeBinary(geOp,
                           builder.makeLocalGet(v, curr->value->type),
                           builder.makeConst(static_cast<From>(0.0)))),
      builder.makeUnary(getReplacementOp(curr->op),
                        builder.makeLocalGet(v, curr->value->type)),
      builder.makeConst(static_cast<To>(0))));
  }